

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O0

int light_update_option(light_pcapng section,light_pcapng pcapng,light_option option)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  light_boolean lVar4;
  void *pvVar5;
  short *in_RDX;
  long in_RSI;
  _light_pcapng *in_RDI;
  light_pcapng unaff_retaddr;
  light_pcapng in_stack_00000008;
  _light_section_header *shb;
  int data_size_diff;
  uint16_t new_data_size;
  uint16_t old_data_size;
  light_option iterator;
  short *local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  for (local_28 = *(short **)(in_RSI + 0x10); (local_28 != (short *)0x0 && (*local_28 != *in_RDX));
      local_28 = *(short **)(local_28 + 8)) {
  }
  if (local_28 == (short *)0x0) {
    iVar3 = light_add_option(in_stack_00000008,unaff_retaddr,
                             (light_option)
                             CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                             (light_boolean)((ulong)in_RDI >> 0x20));
  }
  else {
    if (local_28[1] != in_RDX[1]) {
      if ((in_RDX[1] & 3U) == 0) {
        uVar1 = in_RDX[1];
      }
      else {
        uVar1 = (((ushort)in_RDX[1] >> 2) + 1) * 4;
      }
      if ((local_28[1] & 3U) == 0) {
        uVar2 = local_28[1];
      }
      else {
        uVar2 = (((ushort)local_28[1] >> 2) + 1) * 4;
      }
      *(uint *)(in_RSI + 4) = ((uint)uVar1 - (uint)uVar2) + *(int *)(in_RSI + 4);
      lVar4 = __is_section_header(in_RDI);
      if (lVar4 == LIGHT_TRUE) {
        *(long *)(in_RDI->block_body + 2) =
             (long)(int)((uint)uVar1 - (uint)uVar2) + *(long *)(in_RDI->block_body + 2);
      }
      else {
        fprintf(_stderr,"Warning at: %s::%s::%d, %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_manipulate.c"
                ,"light_update_option",0x9e,"\"PCAPNG block is not section header!\"");
      }
      local_28[1] = in_RDX[1];
      free(*(void **)(local_28 + 4));
      pvVar5 = calloc((ulong)uVar1,1);
      *(void **)(local_28 + 4) = pvVar5;
    }
    memcpy(*(void **)(local_28 + 4),*(void **)(in_RDX + 4),(ulong)(ushort)local_28[1]);
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int light_update_option(light_pcapng section, light_pcapng pcapng, light_option option)
{
	light_option iterator = pcapng->options;
	uint16_t old_data_size, new_data_size;

	while (iterator != NULL) {
		if (iterator->custom_option_code == option->custom_option_code) {
			break;
		}
		iterator = iterator->next_option;
	}

	if (iterator == NULL) {
		return light_add_option(section, pcapng, option, LIGHT_TRUE);
	}

	if (iterator->option_length != option->option_length) {
		PADD32(option->option_length, &new_data_size);
		PADD32(iterator->option_length, &old_data_size);

		int data_size_diff = (int)new_data_size - (int)old_data_size;
		pcapng->block_total_lenght += data_size_diff;

		if (__is_section_header(section) == 1) {
			struct _light_section_header *shb = (struct _light_section_header *)section->block_body;
			shb->section_length += data_size_diff;
		}
		else {
			PCAPNG_WARNING("PCAPNG block is not section header!");
		}

		iterator->option_length = option->option_length;
		free(iterator->data);
		iterator->data = calloc(new_data_size, sizeof(uint8_t));
	}

	memcpy(iterator->data, option->data, iterator->option_length);

	return LIGHT_SUCCESS;
}